

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreencommon.cpp
# Opt level: O3

void * __thiscall
QOffscreenPlatformNativeInterface::nativeResourceForIntegration
          (QOffscreenPlatformNativeInterface *this,QByteArray *resource)

{
  bool bVar1;
  code *pcVar2;
  long in_FS_OFFSET;
  char *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = "setConfiguration";
  bVar1 = operator==(resource,&local_18);
  if (bVar1) {
    pcVar2 = setConfiguration;
  }
  else {
    local_18 = "configuration";
    bVar1 = operator==(resource,&local_18);
    pcVar2 = (code *)0x0;
    if (bVar1) {
      pcVar2 = configuration;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return pcVar2;
  }
  __stack_chk_fail();
}

Assistant:

void *QOffscreenPlatformNativeInterface::nativeResourceForIntegration(const QByteArray &resource)
{
    if (resource == "setConfiguration")
        return reinterpret_cast<void*>(&QOffscreenPlatformNativeInterface::setConfiguration);
    else if (resource == "configuration")
        return reinterpret_cast<void*>(&QOffscreenPlatformNativeInterface::configuration);
    else
        return nullptr;
}